

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_rt_speed_features_framesize_independent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  int iVar1;
  int iVar2;
  AV1_COMMON *cm_00;
  undefined4 uVar3;
  int in_EDX;
  undefined4 *in_RSI;
  long in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int boosted;
  AV1_COMMON *cm;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  iVar1 = frame_is_boosted((AV1_COMP *)0x31002c);
  *(undefined1 *)(in_RSI + 0x1c) = 4;
  *(undefined1 *)(in_RSI + 1) = 1;
  in_RSI[0x7c] = 1;
  in_RSI[0x81] = 0;
  in_RSI[0x7f] = 2;
  in_RSI[0x7e] = 2;
  in_RSI[0x8d] = 1;
  *(undefined1 *)(in_RSI + 0x8f) = 2;
  in_RSI[0x90] = 3;
  in_RSI[0x8b] = 100;
  in_RSI[0xa4] = 0;
  in_RSI[0xa6] = 1;
  in_RSI[0x27] = 1;
  in_RSI[0x45] = 1;
  in_RSI[0x25] = 2;
  in_RSI[0x29] = 2;
  in_RSI[100] = 1;
  in_RSI[0xba] = 0;
  in_RSI[0xd2] = 0;
  in_RSI[0xea] = 1;
  *(undefined1 *)(in_RSI + 0xf3) = 1;
  *(undefined1 *)((long)in_RSI + 0x3cd) = 1;
  in_RSI[0xb7] = 2;
  in_RSI[0xb8] = 2;
  in_RSI[0xbf] = 1;
  *(undefined1 *)(in_RSI + 5) = 2;
  *in_RSI = 0;
  in_RSI[0x95] = 1;
  in_RSI[0x80] = 0;
  in_RSI[0x75] = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  in_RSI[0x8a] = 0xffffffff;
  in_RSI[0x74] = 4;
  in_RSI[0x76] = 2;
  iVar2 = 4;
  if (iVar1 != 0) {
    iVar2 = 0;
  }
  set_txfm_rd_gate_level(in_RSI + 0x6e,iVar2);
  in_RSI[0x9d] = 3;
  in_RSI[0x72] = 4;
  in_RSI[0x6d] = 2;
  in_RSI[0x73] = 1;
  *(undefined1 *)(in_RSI + 0x94) = 3;
  uVar3 = 3;
  if (iVar1 != 0) {
    uVar3 = 1;
  }
  in_RSI[0x71] = uVar3;
  in_RSI[0x79] = 4;
  in_RSI[0xa0] = 1;
  in_RSI[0xa2] = 1;
  in_RSI[0xa5] = 1;
  in_RSI[0xa1] = 1;
  *(undefined1 *)((long)in_RSI + 0xab) = 0xf;
  *(undefined1 *)((long)in_RSI + 0xaa) = 3;
  in_RSI[0x47] = 1;
  in_RSI[0x41] = 1;
  *(undefined8 *)(in_RSI + 0x2c) = 0x2000000;
  *(undefined1 *)(in_RSI + 0x39) = 6;
  in_RSI[0x2e] = 500;
  *(undefined1 *)(in_RSI + 0x24) = 2;
  in_RSI[0x2b] = 2;
  in_RSI[0x65] = 1;
  in_RSI[0x50] = 0x7fffffff;
  in_RSI[0x4c] = 1;
  in_RSI[0x4e] = 1;
  *(undefined1 *)((long)in_RSI + 0x13e) = 1;
  *(undefined1 *)(in_RSI + 0x4a) = 8;
  *(undefined1 *)(in_RSI + 0x4f) = 0;
  *(undefined1 *)(in_RSI + 0x4d) = 1;
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    in_RSI[(long)local_28 + 0xa7] = 1;
    in_RSI[(long)local_28 + 0xac] = 0x2001;
  }
  in_RSI[0xb1] = 5;
  in_RSI[0xb4] = 1;
  in_RSI[0xc0] = 1;
  in_RSI[0xc3] = 1;
  in_RSI[0xc9] = 1;
  in_RSI[0xd1] = 2;
  in_RSI[0xc4] = 1;
  in_RSI[0xc5] = 1;
  in_RSI[0xcb] = 4000;
  in_RSI[0xcc] = 1;
  in_RSI[0xc2] = 1;
  in_RSI[0xc1] = 1;
  *(undefined1 *)(in_RSI + 0xc6) = 3;
  in_RSI[0xd3] = 0;
  in_RSI[199] = 1;
  in_RSI[0xca] = 2;
  in_RSI[0xcf] = 4;
  *(undefined1 *)(in_RSI + 0xd9) = 0;
  in_RSI[0xd6] = 1;
  in_RSI[0xd7] = 2;
  in_RSI[0xd8] = 2;
  in_RSI[0xe9] = 4;
  *(undefined1 *)(in_RSI + 0xe5) = 3;
  iVar2 = frame_is_intra_only(cm_00);
  uVar3 = 3;
  if (iVar2 != 0) {
    uVar3 = 0;
  }
  in_RSI[0xe2] = uVar3;
  in_RSI[0xdd] = 1;
  in_RSI[0xde] = 1;
  in_RSI[0xe3] = 1;
  in_RSI[0xf5] = 1;
  in_RSI[0xf7] = 2;
  in_RSI[0x108] = 1;
  in_RSI[0xfe] = 0;
  in_RSI[0xff] = 0;
  in_RSI[0x100] = 0;
  in_RSI[0x101] = 0;
  in_RSI[0x106] = 1;
  in_RSI[0xfa] = in_RSI[0xfa] | 0x10;
  in_RSI[0x105] = 5;
  in_RSI[0x12f] = 1;
  in_RSI[0x102] = 1;
  in_RSI[0x107] = 1;
  in_RSI[0x12d] = (uint)(iVar1 == 0);
  in_RSI[0x103] = 1;
  in_RSI[0x10c] = 1;
  if (*(int *)(in_RDI + 0x60870) != 0) {
    in_RSI[0x10c] = 0;
  }
  if (((cm_00->current_frame).frame_type != '\0') && (*(int *)(in_RDI + 0x423dc) == 1)) {
    *(undefined1 *)(in_RSI + 0x10b) = 1;
  }
  if ((*(int *)(in_RDI + 0x42370) != 0) &&
     (0x4b000 < *(int *)(in_RDI + 0x3bfb8) * *(int *)(in_RDI + 0x3bfbc))) {
    in_RSI[0x110] = 1;
  }
  in_RSI[0x12a] = 1;
  in_RSI[299] = 1;
  uVar3 = 0x3b;
  if ((cm_00->current_frame).frame_type == '\0') {
    uVar3 = 0;
  }
  in_RSI[0xfa] = uVar3;
  in_RSI[0x133] = 5;
  iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (iVar2 == 0) {
    in_RSI[0x134] = 1;
  }
  in_RSI[0x128] = 0;
  in_RSI[0x129] = 0;
  if (5 < in_EDX) {
    in_RSI[99] = 1;
    in_RSI[0xd8] = 3;
    in_RSI[200] = 0;
    in_RSI[0x9c] = 4;
    in_RSI[0x89] = 8;
    in_RSI[0x9e] = 1;
    in_RSI[0x135] = 1;
    in_RSI[0x12e] = 1;
    in_RSI[0x133] = 7;
    iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar2 == 0) {
      in_RSI[0x134] = 2;
    }
    uVar3 = 3;
    if (iVar1 != 0) {
      uVar3 = 0;
    }
    in_RSI[0xe4] = uVar3;
  }
  if (6 < in_EDX) {
    in_RSI[0x13d] = 1;
    in_RSI[0xfe] = 1;
    in_RSI[0x101] = 1;
    in_RSI[0xc3] = 2;
    *(undefined1 *)(in_RSI + 0x24) = 2;
    *(undefined1 *)(in_RSI + 0x39) = 9;
    *(undefined1 *)(in_RSI + 0x4a) = 8;
    *(undefined1 *)(in_RSI + 0x4f) = 1;
    in_RSI[0x6d] = 2;
    in_RSI[0x79] = 0;
    in_RSI[0xa6] = 0;
    for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
      in_RSI[(long)local_2c + 0xa7] = 0x1fff;
    }
    *(undefined1 *)(in_RSI + 0xe5) = 3;
    in_RSI[0xe9] = 5;
    in_RSI[0xfa] = in_RSI[0xfa] | 0x10;
    in_RSI[0xfb] = 1;
    in_RSI[0x12f] = 0;
    in_RSI[0x12e] = 0;
    *(undefined1 *)(in_RSI + 0x132) = 0;
    in_RSI[0x104] = (uint)((*(byte *)(in_RDI + 0x426e4) & 1) == 0);
    in_RSI[0x103] = 0;
    in_RSI[0xfd] = (uint)(*(int *)(in_RDI + 0x9d338) < 2);
    in_RSI[0xfc] = 1;
    in_RSI[0xf8] = 3;
    in_RSI[0xf6] = 1;
    in_RSI[0x10a] = 1;
    for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
      if (local_30 < 9) {
        in_RSI[(long)local_30 + 0x112] = 7;
      }
      else {
        in_RSI[(long)local_30 + 0x112] = 1;
      }
    }
    in_RSI[0xe2] = 0;
    in_RSI[0x134] = 3;
    *(undefined1 *)(in_RSI + 0x143) = 1;
    *(undefined1 *)((long)in_RSI + 0x513) = 1;
    *(undefined1 *)(in_RSI + 0x145) = 1;
    *(undefined1 *)(in_RSI + 0x147) = 1;
  }
  if (7 < in_EDX) {
    in_RSI[0x13d] = 2;
    in_RSI[0xb2] = 1;
    in_RSI[0x103] = 1;
    in_RSI[0xfd] = 0;
    in_RSI[0xfb] = 2;
    in_RSI[0xf8] = 0;
    in_RSI[0x133] = 8;
    in_RSI[0x134] = 4;
    in_RSI[0x13f] = 1;
    *(undefined1 *)((long)in_RSI + 0x513) = 0;
    in_RSI[0x4b] = 2;
    *(undefined1 *)(in_RSI + 0x122) = 1;
  }
  if (8 < in_EDX) {
    in_RSI[0x13d] = 3;
    in_RSI[0xf7] = 3;
    in_RSI[0x10f] = 3;
    in_RSI[0xf6] = 2;
    in_RSI[0x133] = 9;
    for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
      in_RSI[(long)local_34 + 0x112] = 1;
    }
    in_RSI[0x134] = 0;
    *(undefined1 *)((long)in_RSI + 0x50d) = 1;
    *(undefined1 *)((long)in_RSI + 0x511) = 1;
    in_RSI[0x130] = 0;
    *(undefined1 *)(in_RSI + 0x147) = 1;
    in_RSI[0x4b] = 0;
  }
  if (9 < in_EDX) {
    in_RSI[0x13d] = 4;
    in_RSI[0xfb] = 3;
    in_RSI[0x133] = 10;
    *(undefined1 *)(in_RSI + 0x4d) = 2;
  }
  if (((10 < in_EDX) && (iVar1 = frame_is_intra_only(cm_00), iVar1 == 0)) &&
     (*(int *)(in_RDI + 0x4269c) == 1)) {
    in_RSI[0xe2] = 3;
  }
  return;
}

Assistant:

static void set_rt_speed_features_framesize_independent(AV1_COMP *cpi,
                                                        SPEED_FEATURES *sf,
                                                        int speed) {
  AV1_COMMON *const cm = &cpi->common;
  const int boosted = frame_is_boosted(cpi);

  // Currently, rt speed 0, 1, 2, 3, 4, 5 are the same.
  // Following set of speed features are not impacting encoder's decisions as
  // the relevant tools are disabled by default.
  sf->gm_sf.gm_search_type = GM_DISABLE_SEARCH;
  sf->hl_sf.recode_loop = ALLOW_RECODE_KFARFGF;
  sf->inter_sf.reuse_inter_intra_mode = 1;
  sf->inter_sf.prune_compound_using_single_ref = 0;
  sf->inter_sf.prune_comp_search_by_single_result = 2;
  sf->inter_sf.prune_comp_type_by_comp_avg = 2;
  sf->inter_sf.fast_wedge_sign_estimate = 1;
  sf->inter_sf.use_dist_wtd_comp_flag = DIST_WTD_COMP_DISABLED;
  sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
  sf->inter_sf.disable_interinter_wedge_var_thresh = 100;
  sf->interp_sf.cb_pred_filter_search = 0;
  sf->interp_sf.skip_interp_filter_search = 1;
  sf->part_sf.ml_prune_partition = 1;
  sf->part_sf.reuse_prev_rd_results_for_part_ab = 1;
  sf->part_sf.prune_ext_partition_types_search_level = 2;
  sf->part_sf.less_rectangular_check_level = 2;
  sf->mv_sf.obmc_full_pixel_search_level = 1;
  sf->intra_sf.dv_cost_upd_level = INTERNAL_COST_UPD_OFF;
  sf->tx_sf.model_based_prune_tx_search_level = 0;
  sf->lpf_sf.dual_sgr_penalty_level = 1;
  // Disable Wiener and Self-guided Loop restoration filters.
  sf->lpf_sf.disable_wiener_filter = true;
  sf->lpf_sf.disable_sgr_filter = true;
  sf->intra_sf.prune_palette_search_level = 2;
  sf->intra_sf.prune_luma_palette_size_search_level = 2;
  sf->intra_sf.early_term_chroma_palette_size_search = 1;

  // End of set

  // TODO(any, yunqing): tune these features for real-time use cases.
  sf->hl_sf.superres_auto_search_type = SUPERRES_AUTO_SOLO;
  sf->hl_sf.frame_parameter_update = 0;

  sf->inter_sf.model_based_post_interp_filter_breakout = 1;
  // TODO(any): As per the experiments, this speed feature is doing redundant
  // computation since the model rd based pruning logic is similar to model rd
  // based gating when inter_mode_rd_model_estimation = 2. Enable this SF if
  // either of the condition becomes true.
  //    (1) inter_mode_rd_model_estimation != 2
  //    (2) skip_interp_filter_search == 0
  //    (3) Motion mode or compound mode is enabled */
  sf->inter_sf.prune_mode_search_simple_translation = 0;
  sf->inter_sf.prune_ref_frame_for_rect_partitions = !boosted;
  sf->inter_sf.disable_interintra_wedge_var_thresh = UINT_MAX;
  sf->inter_sf.selective_ref_frame = 4;
  sf->inter_sf.alt_ref_search_fp = 2;
  set_txfm_rd_gate_level(sf->inter_sf.txfm_rd_gate_level, boosted ? 0 : 4);
  sf->inter_sf.limit_txfm_eval_per_mode = 3;

  sf->inter_sf.adaptive_rd_thresh = 4;
  sf->inter_sf.inter_mode_rd_model_estimation = 2;
  sf->inter_sf.prune_inter_modes_if_skippable = 1;
  sf->inter_sf.prune_nearmv_using_neighbors = PRUNE_NEARMV_LEVEL3;
  sf->inter_sf.reduce_inter_modes = boosted ? 1 : 3;
  sf->inter_sf.skip_newmv_in_drl = 4;

  sf->interp_sf.use_fast_interpolation_filter_search = 1;
  sf->interp_sf.use_interp_filter = 1;
  sf->interp_sf.adaptive_interp_filter_search = 1;
  sf->interp_sf.disable_dual_filter = 1;

  sf->part_sf.default_max_partition_size = BLOCK_128X128;
  sf->part_sf.default_min_partition_size = BLOCK_8X8;
  sf->part_sf.use_best_rd_for_pruning = 1;
  sf->part_sf.early_term_after_none_split = 1;
  sf->part_sf.partition_search_breakout_dist_thr = (1 << 25);
  sf->part_sf.max_intra_bsize = BLOCK_16X16;
  sf->part_sf.partition_search_breakout_rate_thr = 500;
  sf->part_sf.partition_search_type = VAR_BASED_PARTITION;
  sf->part_sf.adjust_var_based_rd_partitioning = 2;

  sf->mv_sf.full_pixel_search_level = 1;
  sf->mv_sf.exhaustive_searches_thresh = INT_MAX;
  sf->mv_sf.auto_mv_step_size = 1;
  sf->mv_sf.subpel_iters_per_step = 1;
  sf->mv_sf.use_accurate_subpel_search = USE_2_TAPS;
  sf->mv_sf.search_method = FAST_DIAMOND;
  sf->mv_sf.subpel_force_stop = EIGHTH_PEL;
  sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED;

  for (int i = 0; i < TX_SIZES; ++i) {
    sf->intra_sf.intra_y_mode_mask[i] = INTRA_DC;
    sf->intra_sf.intra_uv_mode_mask[i] = UV_INTRA_DC_CFL;
  }
  sf->intra_sf.skip_intra_in_interframe = 5;
  sf->intra_sf.disable_smooth_intra = 1;
  sf->intra_sf.skip_filter_intra_in_inter_frames = 1;

  sf->tx_sf.intra_tx_size_search_init_depth_sqr = 1;
  sf->tx_sf.tx_type_search.use_reduced_intra_txset = 1;
  sf->tx_sf.adaptive_txb_search_level = 2;
  sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
  sf->tx_sf.tx_size_search_lgr_block = 1;
  sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
  sf->tx_sf.tx_type_search.skip_tx_search = 1;
  sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
  sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
  sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_3;
  sf->tx_sf.refine_fast_tx_search_results = 0;
  sf->tx_sf.tx_type_search.fast_intra_tx_type_search = 1;
  sf->tx_sf.tx_type_search.use_skip_flag_prediction = 2;
  sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;

  sf->rd_sf.optimize_coefficients = NO_TRELLIS_OPT;
  sf->rd_sf.simple_model_rd_from_var = 1;
  sf->rd_sf.tx_domain_dist_level = 2;
  sf->rd_sf.tx_domain_dist_thres_level = 2;

  sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
  sf->lpf_sf.lpf_pick = LPF_PICK_FROM_Q;

  sf->winner_mode_sf.dc_blk_pred_level = frame_is_intra_only(cm) ? 0 : 3;
  sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
  sf->winner_mode_sf.tx_size_search_level = 1;
  sf->winner_mode_sf.winner_mode_ifs = 1;

  sf->rt_sf.check_intra_pred_nonrd = 1;
  sf->rt_sf.estimate_motion_for_var_based_partition = 2;
  sf->rt_sf.hybrid_intra_pickmode = 1;
  sf->rt_sf.use_comp_ref_nonrd = 0;
  sf->rt_sf.ref_frame_comp_nonrd[0] = 0;
  sf->rt_sf.ref_frame_comp_nonrd[1] = 0;
  sf->rt_sf.ref_frame_comp_nonrd[2] = 0;
  sf->rt_sf.use_nonrd_filter_search = 1;
  sf->rt_sf.mode_search_skip_flags |= FLAG_SKIP_INTRA_DIRMISMATCH;
  sf->rt_sf.num_inter_modes_for_tx_search = 5;
  sf->rt_sf.prune_inter_modes_using_temp_var = 1;
  sf->rt_sf.use_real_time_ref_set = 1;
  sf->rt_sf.use_simple_rd_model = 1;
  sf->rt_sf.prune_inter_modes_with_golden_ref = boosted ? 0 : 1;
  // TODO(any): This sf could be removed.
  sf->rt_sf.short_circuit_low_temp_var = 1;
  sf->rt_sf.check_scene_detection = 1;
  if (cpi->rc.rtc_external_ratectrl) sf->rt_sf.check_scene_detection = 0;
  if (cm->current_frame.frame_type != KEY_FRAME &&
      cpi->oxcf.rc_cfg.mode == AOM_CBR)
    sf->rt_sf.overshoot_detection_cbr = FAST_DETECTION_MAXQ;
  // Enable noise estimation only for high resolutions for now.
  //
  // Since use_temporal_noise_estimate has no effect for all-intra frame
  // encoding, it is disabled for this case.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0 && cm->width * cm->height > 640 * 480)
    sf->rt_sf.use_temporal_noise_estimate = 1;
  sf->rt_sf.skip_tx_no_split_var_based_partition = 1;
  sf->rt_sf.skip_newmv_mode_based_on_sse = 1;
  sf->rt_sf.mode_search_skip_flags =
      (cm->current_frame.frame_type == KEY_FRAME)
          ? 0
          : FLAG_SKIP_INTRA_DIRMISMATCH | FLAG_SKIP_INTRA_BESTINTER |
                FLAG_SKIP_COMP_BESTINTRA | FLAG_SKIP_INTRA_LOWVAR |
                FLAG_EARLY_TERMINATE;
  sf->rt_sf.var_part_split_threshold_shift = 5;
  if (!frame_is_intra_only(&cpi->common)) sf->rt_sf.var_part_based_on_qidx = 1;
  sf->rt_sf.use_fast_fixed_part = 0;
  sf->rt_sf.increase_source_sad_thresh = 0;

  if (speed >= 6) {
    sf->mv_sf.use_fullpel_costlist = 1;

    sf->rd_sf.tx_domain_dist_thres_level = 3;

    sf->tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = 0;
    sf->inter_sf.limit_inter_mode_cands = 4;
    sf->inter_sf.prune_warped_prob_thresh = 8;
    sf->inter_sf.extra_prune_warped = 1;

    sf->rt_sf.gf_refresh_based_on_qp = 1;
    sf->rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
    sf->rt_sf.var_part_split_threshold_shift = 7;
    if (!frame_is_intra_only(&cpi->common))
      sf->rt_sf.var_part_based_on_qidx = 2;

    sf->winner_mode_sf.prune_winner_mode_eval_level = boosted ? 0 : 3;
  }

  if (speed >= 7) {
    sf->rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_1;
    sf->rt_sf.use_comp_ref_nonrd = 1;
    sf->rt_sf.ref_frame_comp_nonrd[2] = 1;  // LAST_ALTREF
    sf->tx_sf.intra_tx_size_search_init_depth_sqr = 2;
    sf->part_sf.partition_search_type = VAR_BASED_PARTITION;
    sf->part_sf.max_intra_bsize = BLOCK_32X32;

    sf->mv_sf.search_method = FAST_DIAMOND;
    sf->mv_sf.subpel_force_stop = QUARTER_PEL;

    sf->inter_sf.inter_mode_rd_model_estimation = 2;
    // This sf is not applicable in non-rd path.
    sf->inter_sf.skip_newmv_in_drl = 0;

    sf->interp_sf.skip_interp_filter_search = 0;

    // Disable intra_y_mode_mask pruning since the performance at speed 7 isn't
    // good. May need more study.
    for (int i = 0; i < TX_SIZES; ++i) {
      sf->intra_sf.intra_y_mode_mask[i] = INTRA_ALL;
    }

    sf->lpf_sf.lpf_pick = LPF_PICK_FROM_Q;
    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL5;

    sf->rt_sf.mode_search_skip_flags |= FLAG_SKIP_INTRA_DIRMISMATCH;
    sf->rt_sf.nonrd_prune_ref_frame_search = 1;
    // This is for rd path only.
    sf->rt_sf.prune_inter_modes_using_temp_var = 0;
    sf->rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 0;
    sf->rt_sf.prune_intra_mode_based_on_mv_range = 0;
#if !CONFIG_REALTIME_ONLY
    sf->rt_sf.reuse_inter_pred_nonrd =
        (cpi->oxcf.motion_mode_cfg.enable_warped_motion == 0);
#else
    sf->rt_sf.reuse_inter_pred_nonrd = 1;
#endif
#if CONFIG_AV1_TEMPORAL_DENOISING
    sf->rt_sf.reuse_inter_pred_nonrd = (cpi->oxcf.noise_sensitivity == 0);
#endif
    sf->rt_sf.short_circuit_low_temp_var = 0;
    // For spatial layers, only LAST and GOLDEN are currently used in the SVC
    // for nonrd. The flag use_nonrd_altref_frame can disable GOLDEN in the
    // get_ref_frame_flags() for some patterns, so disable it here for
    // spatial layers.
    sf->rt_sf.use_nonrd_altref_frame =
        (cpi->svc.number_spatial_layers > 1) ? 0 : 1;
    sf->rt_sf.use_nonrd_pick_mode = 1;
    sf->rt_sf.nonrd_check_partition_merge_mode = 3;
    sf->rt_sf.skip_intra_pred = 1;
    sf->rt_sf.source_metrics_sb_nonrd = 1;
    // Set mask for intra modes.
    for (int i = 0; i < BLOCK_SIZES; ++i)
      if (i >= BLOCK_32X32)
        sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC;
      else
        // Use DC, H, V intra mode for block sizes < 32X32.
        sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC_H_V;

    sf->winner_mode_sf.dc_blk_pred_level = 0;
    sf->rt_sf.var_part_based_on_qidx = 3;
    sf->rt_sf.prune_compoundmode_with_singlecompound_var = true;
    sf->rt_sf.prune_compoundmode_with_singlemode_var = true;
    sf->rt_sf.skip_compound_based_on_var = true;
    sf->rt_sf.use_adaptive_subpel_search = true;
  }

  if (speed >= 8) {
    sf->rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_2;
    sf->intra_sf.intra_pruning_with_hog = 1;
    sf->rt_sf.short_circuit_low_temp_var = 1;
    sf->rt_sf.use_nonrd_altref_frame = 0;
    sf->rt_sf.nonrd_prune_ref_frame_search = 2;
    sf->rt_sf.nonrd_check_partition_merge_mode = 0;
    sf->rt_sf.var_part_split_threshold_shift = 8;
    sf->rt_sf.var_part_based_on_qidx = 4;
    sf->rt_sf.partition_direct_merging = 1;
    sf->rt_sf.prune_compoundmode_with_singlemode_var = false;
    sf->mv_sf.use_bsize_dependent_search_method = 2;
    sf->rt_sf.prune_hv_pred_modes_using_src_sad = true;
  }
  if (speed >= 9) {
    sf->rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_3;
    sf->rt_sf.estimate_motion_for_var_based_partition = 3;
    sf->rt_sf.prefer_large_partition_blocks = 3;
    sf->rt_sf.skip_intra_pred = 2;
    sf->rt_sf.var_part_split_threshold_shift = 9;
    for (int i = 0; i < BLOCK_SIZES; ++i)
      sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC;
    sf->rt_sf.var_part_based_on_qidx = 0;
    sf->rt_sf.frame_level_mode_cost_update = true;
    sf->rt_sf.check_only_zero_zeromv_on_large_blocks = true;
    sf->rt_sf.reduce_mv_pel_precision_highmotion = 0;
    sf->rt_sf.use_adaptive_subpel_search = true;
    sf->mv_sf.use_bsize_dependent_search_method = 0;
  }
  if (speed >= 10) {
    sf->rt_sf.sse_early_term_inter_search = EARLY_TERM_IDX_4;
    sf->rt_sf.nonrd_prune_ref_frame_search = 3;
    sf->rt_sf.var_part_split_threshold_shift = 10;
    sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;
  }
  if (speed >= 11 && !frame_is_intra_only(cm) &&
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    sf->winner_mode_sf.dc_blk_pred_level = 3;
  }
}